

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_update_alleles(bcf_hdr_t *hdr,bcf1_t *line,char **alleles,int nals)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  char **ppcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *local_60;
  char *local_50;
  
  uVar12 = (ulong)(uint)nals;
  if (nals < 1) {
    uVar4 = 0;
LAB_001206b6:
    if ((int)uVar4 != nals) {
      local_50 = (line->d).als;
      uVar4 = 0;
      local_60 = (char *)0x0;
      goto LAB_001206dc;
    }
  }
  else {
    pcVar8 = (line->d).als;
    uVar4 = 0;
    do {
      if ((pcVar8 <= alleles[uVar4]) && (alleles[uVar4] < pcVar8 + (line->d).m_als))
      goto LAB_001206b6;
      uVar4 = uVar4 + 1;
    } while (uVar12 != uVar4);
  }
  local_60 = (line->d).als;
  uVar4 = (ulong)(line->d).m_als;
  local_50 = (char *)0x0;
LAB_001206dc:
  if (0 < nals) {
    uVar11 = 0;
    uVar10 = 0;
    do {
      pcVar8 = alleles[uVar11];
      sVar5 = strlen(pcVar8);
      sVar5 = (size_t)(int)sVar5;
      uVar6 = uVar10 + sVar5 + 1;
      pcVar7 = local_60;
      if (uVar6 < uVar4) {
LAB_00120762:
        memcpy(pcVar7 + uVar10,pcVar8,sVar5);
        uVar10 = uVar10 + sVar5;
        pcVar7[uVar10] = '\0';
        local_60 = pcVar7;
      }
      else {
        uVar6 = uVar6 >> 1 | uVar6;
        uVar6 = uVar6 >> 2 | uVar6;
        uVar6 = uVar6 >> 4 | uVar6;
        uVar6 = uVar6 >> 8 | uVar6;
        uVar4 = (uVar6 >> 0x10 | uVar6) + 1;
        pcVar7 = (char *)realloc(local_60,uVar4);
        if (pcVar7 != (char *)0x0) goto LAB_00120762;
      }
      uVar6 = uVar10 + 1;
      pcVar8 = local_60;
      if (uVar6 < uVar4) {
LAB_001207d8:
        pcVar8[uVar10] = '\0';
        pcVar8[uVar6] = '\0';
        uVar10 = uVar6;
        local_60 = pcVar8;
      }
      else {
        uVar4 = uVar6 >> 1 | uVar6;
        uVar4 = uVar4 >> 2 | uVar4;
        uVar4 = uVar4 >> 4 | uVar4;
        uVar4 = uVar4 >> 8 | uVar4;
        uVar4 = (uVar4 >> 0x10 | uVar4) + 1;
        pcVar8 = (char *)realloc(local_60,uVar4);
        if (pcVar8 != (char *)0x0) goto LAB_001207d8;
      }
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  (line->d).als = local_60;
  (line->d).m_als = (int)uVar4;
  free(local_50);
  piVar1 = &(line->d).shared_dirty;
  *(byte *)piVar1 = (byte)*piVar1 | 2;
  *(short *)&line->field_0x12 = (short)nals;
  if ((line->d).m_allele < (int)(nals & 0xffffU)) {
    uVar3 = (nals & 0xffffU) - 1;
    uVar3 = (int)uVar3 >> 1 | uVar3;
    uVar3 = (int)uVar3 >> 2 | uVar3;
    uVar3 = (int)uVar3 >> 4 | uVar3;
    uVar3 = (int)uVar3 >> 8 | uVar3;
    uVar3 = (int)uVar3 >> 0x10 | uVar3;
    (line->d).m_allele = uVar3 + 1;
    ppcVar9 = (char **)realloc((line->d).allele,(long)(int)uVar3 * 8 + 8);
    (line->d).allele = ppcVar9;
  }
  if (0 < nals) {
    pcVar8 = (line->d).als;
    uVar4 = 0;
    do {
      (line->d).allele[uVar4] = pcVar8;
      do {
        cVar2 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar2 != '\0');
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar12);
  }
  return 0;
}

Assistant:

int bcf_update_alleles(const bcf_hdr_t *hdr, bcf1_t *line, const char **alleles, int nals)
{
    kstring_t tmp = {0,0,0};
    char *free_old = NULL;

    // If the supplied alleles are not pointers to line->d.als, the existing block can be reused.
    int i;
    for (i=0; i<nals; i++)
        if ( alleles[i]>=line->d.als && alleles[i]<line->d.als+line->d.m_als ) break;
    if ( i==nals )
    {
        // all alleles point elsewhere, reuse the existing block
        tmp.l = 0; tmp.s = line->d.als; tmp.m = line->d.m_als;
    }
    else
        free_old = line->d.als;

    for (i=0; i<nals; i++)
    {
        kputs(alleles[i], &tmp);
        kputc(0, &tmp);
    }
    line->d.als = tmp.s; line->d.m_als = tmp.m;
    free(free_old);
    return _bcf1_sync_alleles(hdr,line,nals);
}